

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_contains(roaring_bitmap_t *r,uint32_t val)

{
  container_t *c;
  container_t *container;
  uint16_t uStack_1e;
  uint8_t typecode;
  int32_t i;
  uint16_t hb;
  roaring_array_t *prStack_18;
  uint32_t val_local;
  roaring_bitmap_t *r_local;
  
  uStack_1e = (uint16_t)(val >> 0x10);
  i = val;
  prStack_18 = &r->high_low_container;
  container._4_4_ = ra_get_index(&r->high_low_container,uStack_1e);
  if (container._4_4_ < 0) {
    r_local._7_1_ = false;
  }
  else {
    c = ra_get_container_at_index
                  (prStack_18,(uint16_t)container._4_4_,(uint8_t *)((long)&container + 3));
    r_local._7_1_ = container_contains(c,(uint16_t)i,container._3_1_);
  }
  return r_local._7_1_;
}

Assistant:

bool roaring_bitmap_contains(const roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    /*
     * the next function call involves a binary search and lots of branching.
     */
    int32_t i = ra_get_index(&r->high_low_container, hb);
    if (i < 0) return false;

    uint8_t typecode;
    // next call ought to be cheap
    container_t *container =
        ra_get_container_at_index(&r->high_low_container, i, &typecode);
    // rest might be a tad expensive, possibly involving another round of binary search
    return container_contains(container, val & 0xFFFF, typecode);
}